

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O0

void __thiscall sf2cute::SFPreset::SFPreset(SFPreset *this,SFPreset *origin)

{
  bool bVar1;
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  *pvVar2;
  size_type __n;
  undefined1 local_58 [16];
  unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *zone;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  *__range1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_18;
  SFPreset *origin_local;
  SFPreset *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)origin;
  origin_local = this;
  std::__cxx11::string::string((string *)this,(string *)origin);
  this->preset_number_ = *(uint16_t *)&local_18._M_pi[2]._vptr__Sp_counted_base;
  this->bank_ = *(uint16_t *)((long)&local_18._M_pi[2]._vptr__Sp_counted_base + 2);
  this->library_ = *(uint32_t *)((long)&local_18._M_pi[2]._vptr__Sp_counted_base + 4);
  this->genre_ = local_18._M_pi[2]._M_use_count;
  this->morphology_ = local_18._M_pi[2]._M_weak_count;
  memset(&this->zones_,0,0x18);
  std::
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ::vector(&this->zones_);
  std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>::
  unique_ptr<std::default_delete<sf2cute::SFPresetZone>,void>
            ((unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>> *)
             &this->global_zone_,(nullptr_t)0x0);
  this->parent_file_ = (SoundFont *)0x0;
  bVar1 = has_global_zone((SFPreset *)local_18._M_pi);
  if (bVar1) {
    global_zone((SFPreset *)local_18._M_pi);
    std::make_unique<sf2cute::SFPresetZone,sf2cute::SFPresetZone&>
              ((SFPresetZone *)&stack0xffffffffffffffe0);
    std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>::operator=
              (&this->global_zone_,
               (unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               &stack0xffffffffffffffe0);
    std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>::~unique_ptr
              ((unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               &stack0xffffffffffffffe0);
  }
  pvVar2 = zones((SFPreset *)local_18._M_pi);
  __n = std::
        vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
        ::size(pvVar2);
  std::
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ::reserve(&this->zones_,__n);
  pvVar2 = zones((SFPreset *)local_18._M_pi);
  __end1 = std::
           vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ::begin(pvVar2);
  zone = (unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
         std::
         vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
         ::end(pvVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>_>
                                     *)&zone), bVar1) {
    local_58._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>_>
         ::operator*(&__end1);
    std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>::operator*
              ((unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               local_58._8_8_);
    std::make_unique<sf2cute::SFPresetZone,sf2cute::SFPresetZone&>((SFPresetZone *)local_58);
    std::
    vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
    ::push_back(&this->zones_,(value_type *)local_58);
    std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>::~unique_ptr
              ((unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               local_58);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>_>
    ::operator++(&__end1);
  }
  SetBackwardReferences(this);
  return;
}

Assistant:

SFPreset::SFPreset(const SFPreset & origin) :
    name_(origin.name_),
    preset_number_(origin.preset_number_),
    bank_(origin.bank_),
    library_(origin.library_),
    genre_(origin.genre_),
    morphology_(origin.morphology_),
    zones_(),
    global_zone_(nullptr),
    parent_file_(nullptr) {
  // Copy global zone.
  if (origin.has_global_zone()) {
    global_zone_ = std::make_unique<SFPresetZone>(origin.global_zone());
  }

  // Copy preset zones.
  zones_.reserve(origin.zones().size());
  for (const auto & zone : origin.zones()) {
    zones_.push_back(std::make_unique<SFPresetZone>(*zone));
  }

  // Repair references.
  SetBackwardReferences();
}